

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# missing_deps_test.cc
# Opt level: O3

Test * MissingDependencyScannerTestMissingDepPresent::Create(void)

{
  MissingDependencyScannerTest *this;
  
  this = (MissingDependencyScannerTest *)operator_new(0x410);
  MissingDependencyScannerTest::MissingDependencyScannerTest(this);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__MissingDependencyScannerTest_001fc918;
  g_current_test = (Test *)this;
  return &this->super_Test;
}

Assistant:

TEST_F(MissingDependencyScannerTest, MissingDepPresent) {
  CreateInitialState();
  // compiled_object uses generated_header, without a proper dependency
  RecordDepsLogDep("compiled_object", "generated_header");
  ProcessAllNodes();
  ASSERT_TRUE(scanner().HadMissingDeps());
  ASSERT_EQ(1u, scanner().nodes_missing_deps_.size());
  ASSERT_EQ(1u, scanner().missing_dep_path_count_);
  AssertMissingDependencyBetween("compiled_object", "generated_header",
                                 &generator_rule_);
}